

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O2

uint32_t __thiscall
utf16iterator<const_unsigned_short_*>::operator*(utf16iterator<const_unsigned_short_*> *this)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = *this->_ptr;
  uVar2 = (uint)uVar1;
  if ((uVar1 & 0xfc00) == 0xd800) {
    uVar2 = (uVar1 & 0x3ff) * 0x400 + (this->_ptr[1] & 0x3ff) + 0x10000;
  }
  return uVar2;
}

Assistant:

uint32_t operator*() const
    {
        P p= _ptr;
        uint16_t b0= *p++;
        if (b0>=0xd800 && b0<0xdc00) {
            uint16_t b1= *p++;
            return (((b0&0x3ff)<<10)|(b1&0x3ff))+0x10000;
        }
        else {
            return b0;
        }
    }